

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O2

int big_file_list(BigFile *bf,char ***blocknames,int *Nblocks)

{
  bblist *__ptr;
  bblist *pbVar1;
  char **ppcVar2;
  char *pcVar3;
  size_t __size;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  __size = 0;
  __ptr = listbigfile_r(bf->basename,"",(bblist *)0x0);
  lVar4 = 0;
  for (pbVar1 = __ptr; pbVar1 != (bblist *)0x0; pbVar1 = pbVar1->next) {
    lVar4 = lVar4 + 1;
    __size = __size + 8;
  }
  *Nblocks = (int)lVar4;
  ppcVar2 = (char **)malloc(__size);
  *blocknames = ppcVar2;
  lVar5 = 0;
  while (bVar6 = lVar4 != 0, lVar4 = lVar4 + -1, bVar6) {
    pcVar3 = _strdup(__ptr->blockname);
    *(char **)((long)*blocknames + lVar5) = pcVar3;
    pbVar1 = __ptr->next;
    free(__ptr);
    lVar5 = lVar5 + 8;
    __ptr = pbVar1;
  }
  return 0;
}

Assistant:

int
big_file_list(BigFile * bf, char *** blocknames, int * Nblocks)
{
    struct bblist * bblist = listbigfile_r(bf->basename, "", NULL);
    struct bblist * p;
    int N = 0;
    int i;
    for(p = bblist; p; p = p->next) {
        N ++;
    }
    *Nblocks = N;
    *blocknames = malloc(sizeof(char*) * N);
    for(i = 0; i < N; i ++) {
        (*blocknames)[i] = _strdup(bblist->blockname);
        p = bblist;
        bblist = bblist->next;
        free(p); 
    }
    return 0;
}